

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_embedded_oneof(CTcEmbedBuilder *b,int *eos,CTcEmbedLevel *parent)

{
  CTcEmbedTokenList *tl;
  int iVar1;
  CTcSymFunc *this;
  CTcPrsNode *pCVar2;
  char *attrs;
  long lVar3;
  CTcEmbedLevel level;
  CTcEmbedLevel local_40;
  
  tl = G_prs->embed_toks_;
  local_40.typ = 2;
  local_40.parent = parent;
  this = (CTcSymFunc *)CTcPrsMem::alloc(G_prsmem,0x50);
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[1] = (CTcPrsNodeBase)0x0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[2] = (CTcPrsNodeBase)0x0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[3] = (CTcPrsNodeBase)0x0;
  *(undefined8 *)((CTcPrsNode *)&this->super_CTcSymFuncBase + 4) = 0;
  ((anon_union_24_10_6f92a4ee_for_val_ *)((CTcPrsNode *)&this->super_CTcSymFuncBase + 5))->intval_ =
       0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[6] = (CTcPrsNodeBase)0x0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[7] = (CTcPrsNodeBase)0x0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[8] = (CTcPrsNodeBase)0x0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[9] = (CTcPrsNodeBase)0x0;
  (((CTcPrsNode *)&this->super_CTcSymFuncBase)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_003530d0;
  *(int *)((CTcPrsNode *)&this->super_CTcSymFuncBase + 1) = 0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[2] = (CTcPrsNodeBase)0x0;
  ((CTcPrsNode *)&this->super_CTcSymFuncBase)[3] = (CTcPrsNodeBase)0x0;
  *(undefined1 *)((CTcPrsNode *)&this->super_CTcSymFuncBase + 9) = 1;
  ((CTcConstVal *)((CTcPrsNode *)&this->super_CTcSymFuncBase + 4))->typ_ = TC_CVT_LIST;
  ((anon_union_24_10_6f92a4ee_for_val_ *)((CTcPrsNode *)&this->super_CTcSymFuncBase + 5))->
  funcptrval_ = this;
  CTcGenTarg::note_list(G_cg,0);
  (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
  super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)&PTR_gen_code_0035ceb8;
  pCVar2 = parse_embedding_list(b,eos,&local_40);
  if (pCVar2 != (CTcPrsNode *)0x0) {
    do {
      CTPNListBase::add_element((CTPNListBase *)this,pCVar2);
      tl->wrt = tl->head;
      tl->cnt = 0;
      capture_embedded(b,tl);
      iVar1 = CTcEmbedTokenList::match(tl,"or");
      if ((iVar1 == 0) && (iVar1 = CTcEmbedTokenList::match(tl,"||"), iVar1 == 0)) {
        lVar3 = 8;
        goto LAB_0022d931;
      }
      pCVar2 = parse_embedding_list(b,eos,&local_40);
    } while (pCVar2 != (CTcPrsNode *)0x0);
  }
  return (CTcPrsNode *)0x0;
  while (lVar3 = lVar3 + 0x10, lVar3 != 200) {
LAB_0022d931:
    iVar1 = CTcEmbedTokenList::match(tl,*(char **)(&UNK_00351c38 + lVar3));
    if (iVar1 != 0) {
      attrs = *(char **)((long)&one_of_list[0].endph + lVar3);
      if (attrs != (char *)0x0) goto LAB_0022d96d;
      break;
    }
  }
  CTcEmbedTokenList::unget(tl,0,0);
  attrs = "rand";
LAB_0022d96d:
  pCVar2 = create_oneof_node(b,(CTPNList *)this,attrs);
  return pCVar2;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_oneof(
    CTcEmbedBuilder *b, int &eos, CTcEmbedLevel *parent)
{
    /* get the embedding token list capturer */
    CTcEmbedTokenList *tl = G_prs->embed_toks_;

    /* set up our stack level */
    CTcEmbedLevel level(CTcEmbedLevel::OneOf, parent);

    /* create a list node to hold the items */
    CTPNList *lst = new CTPNList();

    /* keep going until we get to the end of the list */
    for (;;)
    {
        /* parse the next string or embedded expression */
        CTcPrsNode *ele = parse_embedding_list(b, eos, &level);
        if (ele == 0)
            return 0;

        /* add this element to the list */
        lst->add_element(ele);

        /* capture the ending token list */
        tl->reset();
        capture_embedded(b, tl);

        /* if we're not at an OR, this is the end of the list */
        if (!tl->match("or") && !tl->match("||"))
            break;
    }

    /* 
     *   Search for a match to one of our endings.  If we don't find one, use
     *   "purely at random" as the default. 
     */
    const char *attrs = 0;
    for (size_t i = 0 ; i < countof(one_of_list) ; ++i)
    {
        /* check for a match */
        if (tl->match(one_of_list[i].endph))
        {
            /* got it - set this attribute and stop searching */
            attrs = one_of_list[i].attr;
            break;
        }
    }

    /* 
     *   if we didn't find a match for the ending tokens, we must have the
     *   ending for an enclosing structure; put the tokens back for the
     *   enclosing structure to parse, and use "purely at random" as the
     *   default 
     */
    if (attrs == 0)
    {
        tl->unget();
        attrs = "rand";
    }

    /* create the one-of list */
    return create_oneof_node(b, lst, attrs);
}